

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::SliceLayerParams::Clear(SliceLayerParams *this)

{
  *(undefined8 *)((long)&this->endindex_ + 4) = 0;
  *(undefined8 *)((long)&this->stride_ + 4) = 0;
  this->startindex_ = 0;
  this->endindex_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SliceLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SliceLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&startindex_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&axis_) -
      reinterpret_cast<char*>(&startindex_)) + sizeof(axis_));
  _internal_metadata_.Clear<std::string>();
}